

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlock.c
# Opt level: O3

int Run(void *data)

{
  Uint32 UVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  FILE *__stream;
  char *__format;
  
  UVar1 = SDL_ThreadID();
  if (UVar1 == mainthread) {
    signal(0xf,closemutex);
  }
  uVar2 = SDL_ThreadID();
  printf("Process %u ready to work\n",(ulong)uVar2);
  iVar3 = SDL_mutexP(mutex);
  __stream = _stderr;
  do {
    _stderr = __stream;
    if (iVar3 < 0) {
      uVar4 = SDL_GetError();
      __format = "Couldn\'t lock mutex: %s";
LAB_0010140c:
      fprintf(__stream,__format,uVar4);
      exit(1);
    }
    uVar2 = SDL_ThreadID();
    printf("Process %u, working!\n",(ulong)uVar2);
    SDL_Delay(1000);
    uVar2 = SDL_ThreadID();
    printf("Process %u, done!\n",(ulong)uVar2);
    iVar3 = SDL_mutexV(mutex);
    __stream = _stderr;
    if (iVar3 < 0) {
      uVar4 = SDL_GetError();
      __format = "Couldn\'t unlock mutex: %s";
      goto LAB_0010140c;
    }
    SDL_Delay(10);
    UVar1 = SDL_ThreadID();
    if ((UVar1 == mainthread) && (doterminate != 0)) {
      uVar2 = SDL_ThreadID();
      printf("Process %u:  raising SIGTERM\n",(ulong)uVar2);
      raise(0xf);
    }
    uVar2 = SDL_ThreadID();
    printf("Process %u ready to work\n",(ulong)uVar2);
    iVar3 = SDL_mutexP(mutex);
    __stream = _stderr;
  } while( true );
}

Assistant:

int SDLCALL Run(void *data)
{
	if ( SDL_ThreadID() == mainthread )
		signal(SIGTERM, closemutex);
	while ( 1 ) {
		printf("Process %u ready to work\n", SDL_ThreadID());
		if ( SDL_mutexP(mutex) < 0 ) {
			fprintf(stderr, "Couldn't lock mutex: %s", SDL_GetError());
			exit(1);
		}
		printf("Process %u, working!\n", SDL_ThreadID());
		SDL_Delay(1*1000);
		printf("Process %u, done!\n", SDL_ThreadID());
		if ( SDL_mutexV(mutex) < 0 ) {
			fprintf(stderr, "Couldn't unlock mutex: %s", SDL_GetError());
			exit(1);
		}
		/* If this sleep isn't done, then threads may starve */
		SDL_Delay(10);
		if (SDL_ThreadID() == mainthread && doterminate) {
			printf("Process %u:  raising SIGTERM\n", SDL_ThreadID());
			raise(SIGTERM);
		}
	}
	return(0);
}